

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::writeAttribute<int>
          (XmlWriter *this,string *name,int *attribute)

{
  stringstream rss;
  string local_1c0;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,*attribute);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
        std::stringstream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }